

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O0

void __thiscall OpenMD::MatrixAccumulator::getStdDev(MatrixAccumulator *this,ResultType *ret)

{
  double *pdVar1;
  RectMatrix<double,_3U,_3U> *in_RSI;
  double dVar2;
  uint j;
  uint i;
  Mat3x3d var;
  RectMatrix<double,_3U,_3U> *ret_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint j_00;
  uint local_68;
  RectMatrix<double,_3U,_3U> local_58;
  RectMatrix<double,_3U,_3U> *local_10;
  
  ret_00 = &local_58;
  local_10 = in_RSI;
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x2ff3b3);
  getVariance((MatrixAccumulator *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
              (ResultType *)ret_00);
  for (local_68 = 0; local_68 < 3; local_68 = local_68 + 1) {
    for (j_00 = 0; j_00 < 3; j_00 = j_00 + 1) {
      pdVar1 = RectMatrix<double,_3U,_3U>::operator()(&local_58,local_68,j_00);
      dVar2 = sqrt(*pdVar1);
      pdVar1 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_68,j_00);
      *pdVar1 = dVar2;
    }
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2ff47f);
  return;
}

Assistant:

void getStdDev(ResultType& ret) {
      assert(Count_ != 0);
      Mat3x3d var;
      this->getVariance(var);
      for (unsigned int i = 0; i < 3; i++) {
        for (unsigned int j = 0; j < 3; j++) {
          ret(i, j) = sqrt(var(i, j));
        }
      }
      return;
    }